

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableStringFieldLiteGenerator::GenerateFieldInfo
          (RepeatedImmutableStringFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_00;
  int iVar1;
  string_view local_30;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_20;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *output_local;
  Printer *printer_local;
  RepeatedImmutableStringFieldLiteGenerator *this_local;
  
  local_20 = output;
  output_local = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)printer;
  printer_local = (Printer *)this;
  iVar1 = FieldDescriptor::number(this->descriptor_);
  WriteIntToUtf16CharSequence(iVar1,local_20);
  iVar1 = GetExperimentalJavaFieldType(this->descriptor_);
  WriteIntToUtf16CharSequence(iVar1,local_20);
  this_00 = output_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,"\"$name$_\",\n");
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)this_00,&this->variables_,local_30);
  return;
}

Assistant:

void RepeatedImmutableStringFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16_t>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  printer->Print(variables_, "\"$name$_\",\n");
}